

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLog>
                 *this,GetterXsYs<long_long> *getter1,GetterXsYRef<long_long> *getter2,
                TransformerLogLog *transformer,ImU32 col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  long lVar6;
  ImPlotPlot *pIVar7;
  GetterXsYRef<long_long> *pGVar8;
  TransformerLogLog *pTVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  long lVar14;
  ImVec2 IVar15;
  ImVec2 IVar16;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar5 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar5 < getter2->Count) {
    iVar13 = iVar5;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  lVar14 = (long)((getter1->Offset % iVar5 + iVar5) % iVar5) * (long)getter1->Stride;
  lVar6 = *(long *)((long)getter1->Ys + lVar14);
  dVar10 = log10((double)*(long *)((long)getter1->Xs + lVar14) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar1 = pIVar12->LogDenX;
  pIVar7 = pIVar12->CurrentPlot;
  dVar2 = (pIVar7->XAxis).Range.Min;
  dVar3 = (pIVar7->XAxis).Range.Max;
  dVar11 = log10((double)lVar6 / pIVar7->YAxis[transformer->YAxis].Range.Min);
  iVar5 = transformer->YAxis;
  pIVar7 = pIVar12->CurrentPlot;
  dVar4 = pIVar7->YAxis[iVar5].Range.Min;
  IVar15.x = (float)((((double)(float)(dVar10 / dVar1) * (dVar3 - dVar2) + dVar2) -
                     (pIVar7->XAxis).Range.Min) * pIVar12->Mx +
                    (double)pIVar12->PixelRange[iVar5].Min.x);
  IVar15.y = (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar5]) *
                       (pIVar7->YAxis[iVar5].Range.Max - dVar4) + dVar4) - dVar4) *
                     pIVar12->My[iVar5] + (double)pIVar12->PixelRange[iVar5].Min.y);
  this->P11 = IVar15;
  pIVar12 = GImPlot;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar8->Count;
  dVar1 = pGVar8->YRef;
  dVar10 = log10((double)*(long *)((long)pGVar8->Xs +
                                  (long)((pGVar8->Offset % iVar5 + iVar5) % iVar5) *
                                  (long)pGVar8->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar12->LogDenX;
  pIVar7 = pIVar12->CurrentPlot;
  dVar3 = (pIVar7->XAxis).Range.Min;
  dVar4 = (pIVar7->XAxis).Range.Max;
  dVar11 = log10(dVar1 / pIVar7->YAxis[pTVar9->YAxis].Range.Min);
  iVar5 = pTVar9->YAxis;
  pIVar7 = pIVar12->CurrentPlot;
  dVar1 = pIVar7->YAxis[iVar5].Range.Min;
  IVar16.x = (float)((((double)(float)(dVar10 / dVar2) * (dVar4 - dVar3) + dVar3) -
                     (pIVar7->XAxis).Range.Min) * pIVar12->Mx +
                    (double)pIVar12->PixelRange[iVar5].Min.x);
  IVar16.y = (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar5]) *
                       (pIVar7->YAxis[iVar5].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar12->My[iVar5] + (double)pIVar12->PixelRange[iVar5].Min.y);
  this->P12 = IVar16;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }